

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O1

void __thiscall
cmCTestCoverageHandler::CleanCoverageLogFiles(cmCTestCoverageHandler *this,ostream *log)

{
  cmCTest *this_00;
  string *psVar1;
  _Alloc_hider _Var2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  ostream *poVar4;
  string *f;
  string *source;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string logGlob;
  Glob gl;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  undefined1 local_80 [16];
  _Alloc_hider local_70;
  char *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined8 local_50;
  pointer local_48;
  
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"BuildDirectory","");
  cmCTest::GetCTestConfiguration(&local_c0,this_00,&local_e0);
  _Var2._M_p = local_c0._M_dataplus._M_p;
  cmCTest::GetCurrentTag_abi_cxx11_(&local_100,(this->super_cmCTestGenericHandler).CTest);
  local_80._0_8_ = local_c0._M_string_length;
  local_80._8_8_ = _Var2._M_p;
  local_70._M_p = (pointer)0x9;
  local_68 = "/Testing/";
  local_60._M_allocated_capacity = local_100._M_string_length;
  local_60._8_8_ = local_100._M_dataplus._M_p;
  local_50._0_1_ = true;
  local_50._1_3_ = 0;
  local_50._4_4_ = 0;
  local_48 = (pointer)0x751f50;
  views._M_len = 4;
  views._M_array = (iterator)local_80;
  cmCatViews_abi_cxx11_(&local_a0,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  cmsys::Glob::Glob((Glob *)local_80);
  cmsys::Glob::FindFiles((Glob *)local_80,&local_a0,(GlobMessages *)0x0);
  pvVar3 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_80);
  psVar1 = (pvVar3->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (source = (pvVar3->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; source != psVar1; source = source + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(log,"Removing old coverage log: ",0x1b);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (log,(source->_M_dataplus)._M_p,source->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    cmsys::SystemTools::RemoveFile(source);
  }
  cmsys::Glob::~Glob((Glob *)local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestCoverageHandler::CleanCoverageLogFiles(std::ostream& log)
{
  std::string logGlob =
    cmStrCat(this->CTest->GetCTestConfiguration("BuildDirectory"), "/Testing/",
             this->CTest->GetCurrentTag(), "/CoverageLog*");
  cmsys::Glob gl;
  gl.FindFiles(logGlob);
  std::vector<std::string> const& files = gl.GetFiles();
  for (std::string const& f : files) {
    log << "Removing old coverage log: " << f << "\n";
    cmSystemTools::RemoveFile(f);
  }
}